

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreEarlyFragmentTestsTest::isTextureFilledWithValue
          (ImageLoadStoreEarlyFragmentTestsTest *this,GLfloat value)

{
  GLfloat GVar1;
  GLenum err;
  reference pvVar2;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  MessageBuilder local_1a0;
  uint local_20;
  GLfloat local_1c;
  GLuint i;
  GLfloat value_local;
  ImageLoadStoreEarlyFragmentTestsTest *this_local;
  
  local_1c = value;
  _i = this;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_extracted_texture_data,0)
  ;
  glu::CallLogWrapper::glGetTexImage
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0,0x1903,0x1406,pvVar2);
  err = glu::CallLogWrapper::glGetError
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper);
  glu::checkError(err,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2775);
  local_20 = 0;
  while( true ) {
    GVar1 = local_1c;
    if (this->m_image_edge * this->m_image_edge <= local_20) {
      return true;
    }
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&this->m_extracted_texture_data,(ulong)local_20);
    if ((GVar1 != *pvVar2) || (NAN(GVar1) || NAN(*pvVar2))) break;
    local_20 = local_20 + 1;
  }
  this_00 = deqp::Context::getTestContext
                      ((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                       m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [19])"Texel at location ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_20);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [21])" has invalid value: ");
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     (&this->m_extracted_texture_data,(ulong)local_20);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,pvVar2);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2b39b84);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return false;
}

Assistant:

bool isTextureFilledWithValue(GLfloat value)
	{
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RED, GL_FLOAT, &m_extracted_texture_data[0]);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetTexImage");

		for (GLuint i = 0; i < m_image_edge * m_image_edge; ++i)
		{
			if (value != m_extracted_texture_data[i])
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Texel at location " << i
													<< " has invalid value: " << m_extracted_texture_data[i]
													<< " expected: " << value << tcu::TestLog::EndMessage;

				return false;
			}
		}

		return true;
	}